

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_v_predictor_8x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  short sVar25;
  short sVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  short sVar40;
  ushort uVar41;
  ushort uVar42;
  short sVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar43 [16];
  ushort uVar56;
  undefined1 auVar57 [16];
  ushort uVar58;
  undefined1 in_XMM4 [16];
  ushort uVar59;
  ushort uVar60;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  
  auVar26 = pshuflw(ZEXT116(left_column[3]),ZEXT116(left_column[3]),0);
  auVar27._0_2_ = auVar26._0_2_;
  sVar25 = auVar26._2_2_;
  auVar27._2_2_ = sVar25 * 0x6b;
  auVar27._4_2_ = auVar27._0_2_ * 0xab;
  auVar27._6_2_ = sVar25 * 0xc0;
  auVar27._8_2_ = auVar27._0_2_ * 0x100;
  auVar27._10_2_ = sVar25 * 0x100;
  auVar27._12_2_ = auVar27._0_2_ * 0x100;
  auVar27._14_2_ = sVar25 * 0x100;
  uVar1 = *(ulong *)top_row;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar1;
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xe] = (char)(uVar1 >> 0x38);
  auVar11._8_4_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xc] = (char)(uVar1 >> 0x30);
  auVar11._13_2_ = auVar10._13_2_;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_3_ = auVar11._12_3_;
  uVar35 = (undefined1)(uVar1 >> 0x28);
  auVar13._8_2_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13[10] = uVar35;
  auVar13._11_4_ = auVar12._11_4_;
  auVar14._8_2_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._10_5_ = auVar13._10_5_;
  uVar34 = (undefined1)(uVar1 >> 0x20);
  auVar15[8] = uVar34;
  auVar15._0_8_ = uVar1;
  auVar15._9_6_ = auVar14._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar15._8_7_;
  uVar33 = (undefined1)(uVar1 >> 0x18);
  Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),uVar33);
  auVar20._9_6_ = 0;
  auVar20._0_9_ = Var17;
  uVar32 = (undefined1)(uVar1 >> 0x10);
  auVar18._1_10_ = SUB1510(auVar20 << 0x30,5);
  auVar18[0] = uVar32;
  auVar21._11_4_ = 0;
  auVar21._0_11_ = auVar18;
  uVar31 = (undefined1)(uVar1 >> 8);
  auVar19._1_12_ = SUB1512(auVar21 << 0x20,3);
  auVar19[0] = uVar31;
  auVar29._0_2_ = CONCAT11(0,(byte)uVar1);
  auVar29._2_13_ = auVar19;
  auVar29[0xf] = 0;
  auVar22[10] = 0;
  auVar22._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar22[0xb] = uVar35;
  auVar23[9] = uVar34;
  auVar23._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar23._10_2_ = auVar22._10_2_;
  auVar24._9_3_ = auVar23._9_3_;
  auVar24._0_9_ = (unkuint9)0;
  auVar57 = ZEXT516(CONCAT41(auVar24._8_4_,uVar33)) << 0x38;
  auVar30._1_10_ = auVar57._6_10_;
  auVar30[0] = uVar32;
  auVar30._11_5_ = 0;
  auVar26._1_12_ = SUB1612(auVar30 << 0x28,4);
  auVar26[0] = uVar31;
  auVar26._13_3_ = 0;
  sVar25 = auVar19._0_2_;
  sVar28 = auVar18._0_2_;
  sVar36 = (short)Var17;
  sVar37 = auVar15._8_2_;
  sVar38 = auVar13._10_2_;
  sVar39 = auVar11._12_2_;
  uVar58 = auVar10._13_2_ >> 8;
  auVar43 = pshuflw(auVar43,auVar27,0);
  sVar40 = auVar43._0_2_ + 0x80;
  sVar44 = auVar43._2_2_ + 0x80;
  uVar41 = sVar40 + ((ushort)(byte)uVar1 * 0x100 - auVar29._0_2_);
  uVar45 = sVar44 + (SUB162(auVar26 << 0x18,2) - sVar25);
  uVar47 = sVar40 + (SUB162(auVar30 << 0x28,4) - sVar28);
  uVar49 = sVar44 + (auVar57._6_2_ - sVar36);
  uVar51 = sVar40 + (auVar24._8_2_ - sVar37);
  uVar53 = sVar44 + (auVar22._10_2_ - sVar38);
  uVar42 = uVar41 >> 8;
  uVar46 = uVar45 >> 8;
  uVar48 = uVar47 >> 8;
  uVar50 = uVar49 >> 8;
  uVar52 = uVar51 >> 8;
  uVar54 = uVar53 >> 8;
  uVar55 = (ushort)(sVar40 - sVar39) >> 8;
  uVar56 = (ushort)(sVar44 - uVar58) >> 8;
  *(ulong *)dst =
       CONCAT17((uVar56 != 0) * (uVar56 < 0x100) * (char)((ushort)(sVar44 - uVar58) >> 8) -
                (0xff < uVar56),
                CONCAT16((uVar55 != 0) * (uVar55 < 0x100) * (char)((ushort)(sVar40 - sVar39) >> 8) -
                         (0xff < uVar55),
                         CONCAT15((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) -
                                  (0xff < uVar54),
                                  CONCAT14((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) -
                                           (0xff < uVar52),
                                           CONCAT13((uVar50 != 0) * (uVar50 < 0x100) *
                                                    (char)(uVar49 >> 8) - (0xff < uVar50),
                                                    CONCAT12((uVar48 != 0) * (uVar48 < 0x100) *
                                                             (char)(uVar47 >> 8) - (0xff < uVar48),
                                                             CONCAT11((uVar46 != 0) *
                                                                      (uVar46 < 0x100) *
                                                                      (char)(uVar45 >> 8) -
                                                                      (0xff < uVar46),
                                                                      (uVar42 != 0) *
                                                                      (uVar42 < 0x100) *
                                                                      (char)(uVar41 >> 8) -
                                                                      (0xff < uVar42))))))));
  auVar26 = pshuflw(in_XMM4,auVar27,0x55);
  sVar40 = auVar26._0_2_ + 0x80;
  sVar44 = auVar26._2_2_ + 0x80;
  uVar41 = sVar40 + auVar29._0_2_ * 0x95;
  uVar45 = sVar44 + sVar25 * 0x95;
  uVar47 = sVar40 + sVar28 * 0x95;
  uVar49 = sVar44 + sVar36 * 0x95;
  uVar51 = sVar40 + sVar37 * 0x95;
  uVar53 = sVar44 + sVar38 * 0x95;
  uVar55 = sVar40 + sVar39 * 0x95;
  uVar59 = sVar44 + uVar58 * 0x95;
  uVar42 = uVar41 >> 8;
  uVar46 = uVar45 >> 8;
  uVar48 = uVar47 >> 8;
  uVar50 = uVar49 >> 8;
  uVar52 = uVar51 >> 8;
  uVar54 = uVar53 >> 8;
  uVar56 = uVar55 >> 8;
  uVar60 = uVar59 >> 8;
  cVar2 = (char)(uVar41 >> 8);
  cVar3 = (char)(uVar45 >> 8);
  cVar4 = (char)(uVar47 >> 8);
  cVar5 = (char)(uVar49 >> 8);
  cVar6 = (char)(uVar51 >> 8);
  cVar7 = (char)(uVar53 >> 8);
  cVar8 = (char)(uVar55 >> 8);
  cVar9 = (char)(uVar59 >> 8);
  auVar57._0_8_ =
       CONCAT17((uVar60 != 0) * (uVar60 < 0x100) * cVar9 - (0xff < uVar60),
                CONCAT16((uVar56 != 0) * (uVar56 < 0x100) * cVar8 - (0xff < uVar56),
                         CONCAT15((uVar54 != 0) * (uVar54 < 0x100) * cVar7 - (0xff < uVar54),
                                  CONCAT14((uVar52 != 0) * (uVar52 < 0x100) * cVar6 -
                                           (0xff < uVar52),
                                           CONCAT13((uVar50 != 0) * (uVar50 < 0x100) * cVar5 -
                                                    (0xff < uVar50),
                                                    CONCAT12((uVar48 != 0) * (uVar48 < 0x100) *
                                                             cVar4 - (0xff < uVar48),
                                                             CONCAT11((uVar46 != 0) *
                                                                      (uVar46 < 0x100) * cVar3 -
                                                                      (0xff < uVar46),
                                                                      (uVar42 != 0) *
                                                                      (uVar42 < 0x100) * cVar2 -
                                                                      (0xff < uVar42))))))));
  auVar57[8] = (uVar42 != 0) * (uVar42 < 0x100) * cVar2 - (0xff < uVar42);
  auVar57[9] = (uVar46 != 0) * (uVar46 < 0x100) * cVar3 - (0xff < uVar46);
  auVar57[10] = (uVar48 != 0) * (uVar48 < 0x100) * cVar4 - (0xff < uVar48);
  auVar57[0xb] = (uVar50 != 0) * (uVar50 < 0x100) * cVar5 - (0xff < uVar50);
  auVar57[0xc] = (uVar52 != 0) * (uVar52 < 0x100) * cVar6 - (0xff < uVar52);
  auVar57[0xd] = (uVar54 != 0) * (uVar54 < 0x100) * cVar7 - (0xff < uVar54);
  auVar57[0xe] = (uVar56 != 0) * (uVar56 < 0x100) * cVar8 - (0xff < uVar56);
  auVar57[0xf] = (uVar60 != 0) * (uVar60 < 0x100) * cVar9 - (0xff < uVar60);
  *(undefined8 *)(dst + stride) = auVar57._0_8_;
  auVar26 = pshuflw(auVar57,auVar27,0xaa);
  sVar40 = auVar26._0_2_ + 0x80;
  sVar44 = auVar26._2_2_ + 0x80;
  uVar41 = sVar40 + auVar29._0_2_ * 0x55;
  uVar42 = sVar44 + sVar25 * 0x55;
  uVar46 = sVar40 + sVar28 * 0x55;
  uVar48 = sVar44 + sVar36 * 0x55;
  uVar50 = sVar40 + sVar37 * 0x55;
  uVar52 = sVar44 + sVar38 * 0x55;
  uVar54 = sVar40 + sVar39 * 0x55;
  uVar56 = sVar44 + uVar58 * 0x55;
  uVar58 = uVar41 >> 8;
  uVar45 = uVar42 >> 8;
  uVar47 = uVar46 >> 8;
  uVar49 = uVar48 >> 8;
  uVar51 = uVar50 >> 8;
  uVar53 = uVar52 >> 8;
  uVar55 = uVar54 >> 8;
  uVar59 = uVar56 >> 8;
  *(ulong *)(dst + stride * 2) =
       CONCAT17((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar59),
                CONCAT16((uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55),
                         CONCAT15((uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) -
                                  (0xff < uVar53),
                                  CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) -
                                           (0xff < uVar51),
                                           CONCAT13((uVar49 != 0) * (uVar49 < 0x100) *
                                                    (char)(uVar48 >> 8) - (0xff < uVar49),
                                                    CONCAT12((uVar47 != 0) * (uVar47 < 0x100) *
                                                             (char)(uVar46 >> 8) - (0xff < uVar47),
                                                             CONCAT11((uVar45 != 0) *
                                                                      (uVar45 < 0x100) *
                                                                      (char)(uVar42 >> 8) -
                                                                      (0xff < uVar45),
                                                                      (uVar58 != 0) *
                                                                      (uVar58 < 0x100) *
                                                                      (char)(uVar41 >> 8) -
                                                                      (0xff < uVar58))))))));
  auVar30 = psllw(auVar29,6);
  auVar26 = pshuflw(auVar27,auVar27,0xff);
  sVar25 = auVar26._0_2_ + 0x80;
  sVar28 = auVar26._2_2_ + 0x80;
  uVar58 = sVar25 + auVar30._0_2_;
  uVar42 = sVar28 + auVar30._2_2_;
  uVar46 = sVar25 + auVar30._4_2_;
  uVar48 = sVar28 + auVar30._6_2_;
  uVar50 = sVar25 + auVar30._8_2_;
  uVar52 = sVar28 + auVar30._10_2_;
  uVar54 = sVar25 + auVar30._12_2_;
  uVar56 = sVar28 + auVar30._14_2_;
  uVar41 = uVar58 >> 8;
  uVar45 = uVar42 >> 8;
  uVar47 = uVar46 >> 8;
  uVar49 = uVar48 >> 8;
  uVar51 = uVar50 >> 8;
  uVar53 = uVar52 >> 8;
  uVar55 = uVar54 >> 8;
  uVar59 = uVar56 >> 8;
  *(ulong *)(dst + stride * 3) =
       CONCAT17((uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar59),
                CONCAT16((uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55),
                         CONCAT15((uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) -
                                  (0xff < uVar53),
                                  CONCAT14((uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) -
                                           (0xff < uVar51),
                                           CONCAT13((uVar49 != 0) * (uVar49 < 0x100) *
                                                    (char)(uVar48 >> 8) - (0xff < uVar49),
                                                    CONCAT12((uVar47 != 0) * (uVar47 < 0x100) *
                                                             (char)(uVar46 >> 8) - (0xff < uVar47),
                                                             CONCAT11((uVar45 != 0) *
                                                                      (uVar45 < 0x100) *
                                                                      (char)(uVar42 >> 8) -
                                                                      (0xff < uVar45),
                                                                      (uVar41 != 0) *
                                                                      (uVar41 < 0x100) *
                                                                      (char)(uVar58 >> 8) -
                                                                      (0xff < uVar41))))))));
  return;
}

Assistant:

void aom_smooth_v_predictor_8x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[3]);
  const __m128i weights = cvtepu8_epi16(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i y_select = _mm_set1_epi32(0x01000100);
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
  __m128i scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                &round);
}